

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
pstore::serialize::
read<std::set<int,std::less<int>,std::allocator<int>>,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,serialize *this,
          range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *archive)

{
  unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  type uninit_buffer;
  __uniq_ptr_impl<std::set<int,_std::less<int>,_std::allocator<int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_50;
  undefined1 local_48 [8];
  _Rb_tree_header local_40;
  
  flood<pstore::serialize::details::aligned_storage<48ul,8ul>::type>((type *)local_48);
  serializer<std::set<int,std::less<int>,std::allocator<int>>,void>::
  read<pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
            ((range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)this,(value_type *)local_48);
  local_50._M_t.
  super__Tuple_impl<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  .super__Head_base<0UL,_std::set<int,_std::less<int>,_std::allocator<int>_>_*,_false>._M_head_impl
       = (tuple<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
          )(tuple<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
            )local_48;
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,&local_40);
  std::
  unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr((unique_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                 *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }